

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

int Configtable_insert(config *data)

{
  uint uVar1;
  long *plVar2;
  size_t __nmemb;
  s_x4 *psVar3;
  uint uVar4;
  int iVar5;
  s_x4node *psVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  config *pcVar10;
  int iVar11;
  config *pcVar12;
  s_x4node *psVar13;
  config **ppcVar14;
  
  psVar3 = x4a;
  if (x4a != (s_x4 *)0x0) {
    uVar4 = data->rp->index * 0x25 + data->dot;
    iVar11 = x4a->size;
    uVar7 = (ulong)(iVar11 - 1U & uVar4);
    psVar13 = (s_x4node *)x4a->ht;
    ppcVar14 = &psVar13->data + uVar7;
    do {
      pcVar12 = *ppcVar14;
      if (pcVar12 == (config *)0x0) {
        uVar1 = psVar3->count;
        if ((int)uVar1 < iVar11) {
          psVar6 = psVar3->tbl;
        }
        else {
          __nmemb = (long)iVar11 * 2;
          psVar6 = (s_x4node *)calloc(__nmemb,0x20);
          if (psVar6 == (s_x4node *)0x0) {
            return 0;
          }
          psVar13 = psVar6 + (long)iVar11 * 2;
          uVar7 = 0;
          iVar11 = (int)__nmemb;
          uVar9 = 0;
          if (0 < iVar11) {
            uVar9 = __nmemb & 0xffffffff;
          }
          for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
            (&psVar13->data)[uVar7] = (config *)0x0;
          }
          lVar8 = 0;
          uVar7 = 0;
          if (0 < (int)uVar1) {
            uVar7 = (ulong)uVar1;
          }
          for (; uVar7 * 0x18 - lVar8 != 0; lVar8 = lVar8 + 0x18) {
            plVar2 = *(long **)((long)&psVar3->tbl->data + lVar8);
            ppcVar14 = &psVar13->data +
                       (*(int *)(*plVar2 + 0x60) * 0x25 + (int)plVar2[1] & iVar11 - 1U);
            if (*ppcVar14 == (config *)0x0) {
              pcVar12 = (config *)0x0;
            }
            else {
              (*ppcVar14)->fws = (char *)((long)&psVar6->next + lVar8);
              pcVar12 = *ppcVar14;
            }
            *(config **)((long)&psVar6->next + lVar8) = pcVar12;
            *(long **)((long)&psVar6->data + lVar8) = plVar2;
            *(config ***)((long)&psVar6->from + lVar8) = ppcVar14;
            *ppcVar14 = (config *)((long)&psVar6->data + lVar8);
          }
          free(psVar3->tbl);
          psVar3->size = iVar11;
          psVar3->tbl = psVar6;
          psVar3->ht = (s_x4node **)psVar13;
          uVar7 = (ulong)(iVar11 - 1U & uVar4);
        }
        psVar3->count = uVar1 + 1;
        pcVar12 = (config *)(psVar6 + (int)uVar1);
        psVar6[(int)uVar1].data = data;
        if ((&psVar13->data)[uVar7] == (config *)0x0) {
          pcVar10 = (config *)0x0;
        }
        else {
          (&psVar13->data)[uVar7]->fws = (char *)&pcVar12->dot;
          pcVar10 = (&psVar13->data)[uVar7];
        }
        *(config **)&pcVar12->dot = pcVar10;
        (&psVar13->data)[uVar7] = pcVar12;
        pcVar12->fws = (char *)(psVar3->ht + uVar7);
        return 1;
      }
      iVar5 = Configcmp((char *)pcVar12->rp,(char *)data);
      ppcVar14 = (config **)&pcVar12->dot;
    } while (iVar5 != 0);
  }
  return 0;
}

Assistant:

int Configtable_insert(struct config *data)
{
  x4node *np;
  unsigned h;
  unsigned ph;

  if( x4a==0 ) return 0;
  ph = confighash(data);
  h = ph & (x4a->size-1);
  np = x4a->ht[h];
  while( np ){
    if( Configcmp((const char *) np->data,(const char *) data)==0 ){
      /* An existing entry with the same key is found. */
      /* Fail because overwrite is not allows. */
      return 0;
    }
    np = np->next;
  }
  if( x4a->count>=x4a->size ){
    /* Need to make the hash table bigger */
    int i,size;
    struct s_x4 array;
    array.size = size = x4a->size*2;
    array.count = x4a->count;
    array.tbl = (x4node*)calloc(size, sizeof(x4node) + sizeof(x4node*));
    if( array.tbl==0 ) return 0;  /* Fail due to malloc failure */
    array.ht = (x4node**)&(array.tbl[size]);
    for(i=0; i<size; i++) array.ht[i] = 0;
    for(i=0; i<x4a->count; i++){
      x4node *oldnp, *newnp;
      oldnp = &(x4a->tbl[i]);
      h = confighash(oldnp->data) & (size-1);
      newnp = &(array.tbl[i]);
      if( array.ht[h] ) array.ht[h]->from = &(newnp->next);
      newnp->next = array.ht[h];
      newnp->data = oldnp->data;
      newnp->from = &(array.ht[h]);
      array.ht[h] = newnp;
    }
    free(x4a->tbl);
    *x4a = array;
  }
  /* Insert the new data */
  h = ph & (x4a->size-1);
  np = &(x4a->tbl[x4a->count++]);
  np->data = data;
  if( x4a->ht[h] ) x4a->ht[h]->from = &(np->next);
  np->next = x4a->ht[h];
  x4a->ht[h] = np;
  np->from = &(x4a->ht[h]);
  return 1;
}